

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O1

int asn1_write_tagged_int(uchar **p,uchar *start,int val,int tag)

{
  uchar *puVar1;
  size_t sVar2;
  int iVar3;
  size_t len;
  
  sVar2 = 1;
  do {
    len = sVar2;
    puVar1 = *p;
    if (puVar1 == start || (long)puVar1 - (long)start < 0) {
      return -0x6c;
    }
    *p = puVar1 + -1;
    puVar1[-1] = (uchar)val;
    val = val >> 8;
    sVar2 = len + 1;
  } while (0 < val);
  puVar1 = *p;
  if ((char)*puVar1 < '\0') {
    if (puVar1 == start || (long)puVar1 - (long)start < 0) {
      return -0x6c;
    }
    *p = puVar1 + -1;
    puVar1[-1] = '\0';
    len = len + 1;
  }
  iVar3 = mbedtls_asn1_write_len_and_tag(p,start,len,(uchar)tag);
  return iVar3;
}

Assistant:

static int asn1_write_tagged_int(unsigned char **p, const unsigned char *start, int val, int tag)
{
    size_t len = 0;

    do {
        if (*p - start < 1) {
            return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
        }
        len += 1;
        *--(*p) = val & 0xff;
        val >>= 8;
    } while (val > 0);

    if (**p & 0x80) {
        if (*p - start < 1) {
            return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
        }
        *--(*p) = 0x00;
        len += 1;
    }

    return mbedtls_asn1_write_len_and_tag(p, start, len, tag);
}